

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::_::Event::~Event(Event *this)

{
  bool bVar1;
  Fault local_28;
  Fault f;
  DebugExpression<bool> _kjCondition;
  Event *this_local;
  
  this->_vptr_Event = (_func_int **)&PTR___cxa_pure_virtual_00d9b4c8;
  this->live = 0;
  disarm(this);
  f.exception._6_1_ = ~this->firing & 1;
  f.exception._7_1_ =
       DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7));
  if (!bVar1) {
    Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[35]>
              (&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x881,FAILED,"!firing","_kjCondition,\"Promise callback destroyed itself.\"",
               (DebugExpression<bool> *)((long)&f.exception + 7),
               (char (*) [35])"Promise callback destroyed itself.");
    Debug::Fault::fatal(&local_28);
  }
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

Event::~Event() noexcept {  // intentionally noexcept
  live = 0;

  // Prevent compiler from eliding this store above. This line probably isn't needed because there
  // are complex calls later in this destructor, and the compiler probably can't prove that they
  // won't come back and examine `live`, so it won't elide the write anyway. However, an
  // atomic_signal_fence is also sufficient to tell the compiler that a signal handler might access
  // `live`, so it won't optimize away the write. Note that a signal fence does not produce
  // any instructions, it just blocks compiler optimizations.
  std::atomic_signal_fence(std::memory_order_acq_rel);

  disarm();

  // If this fails, we'll abort due to `noexcept`. That's good because otherwise we're likely to
  // be in a use-after-free situation.
  KJ_REQUIRE(!firing, "Promise callback destroyed itself.");
}